

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintUsers(InstructionVMGraphContext *ctx,VmValue *value,bool fullNames)

{
  ulong uVar1;
  
  if (ctx->showUsers != true) {
    return;
  }
  Print(ctx,"[");
  if (value->hasSideEffects == true) {
    Print(ctx,"self");
  }
  if ((value->users).count != 0) {
    uVar1 = 0;
    do {
      if ((uVar1 != 0) || (value->hasSideEffects != false)) {
        Print(ctx,", ");
      }
      if ((value->users).count <= uVar1) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 8>::operator[](unsigned int) [T = VmValue *, N = 8]"
                     );
      }
      PrintName(ctx,(value->users).data[uVar1],fullNames,true);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (value->users).count);
  }
  Print(ctx,"] ");
  return;
}

Assistant:

void PrintUsers(InstructionVMGraphContext &ctx, VmValue *value, bool fullNames)
{
	if(!ctx.showUsers)
		return;

	Print(ctx, "[");

	if(value->hasSideEffects)
		Print(ctx, "self");

	for(unsigned i = 0; i < value->users.size(); i++)
	{
		if(value->hasSideEffects || i != 0)
			Print(ctx, ", ");

		PrintName(ctx, value->users[i], fullNames, true);
	}

	Print(ctx, "] ");
}